

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_98 [8];
  Hospital New_Hospital;
  
  New_Hospital.All_Of_Patients.super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Hospital::Hospital((Hospital *)local_98);
  Hospital::menu((Hospital *)local_98);
  New_Hospital.All_Of_Patients.super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Hospital::~Hospital((Hospital *)local_98);
  return New_Hospital.All_Of_Patients.super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {

    Hospital New_Hospital;
    New_Hospital.menu();

    return 0;
}